

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O2

REF_STATUS
ref_gather_node_tec_block
          (REF_NODE ref_node,REF_GLOB nnode,REF_GLOB *l2c,REF_INT ldim,REF_DBL *scalar,
          int dataformat,FILE *file)

{
  REF_MPI ref_mpi;
  size_t sVar1;
  uint uVar2;
  REF_STATUS RVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  REF_INT *sorted_index;
  REF_GLOB *original;
  void *pvVar7;
  ulong uVar8;
  void *__ptr;
  size_t sVar9;
  int iVar10;
  REF_DBL *pRVar11;
  undefined8 uVar12;
  REF_STATUS ref_private_macro_code_rxs;
  uint uVar13;
  long lVar14;
  size_t sVar15;
  char *pcVar16;
  uint uVar17;
  uint local_a8;
  REF_LONG ref_private_status_reis_ai;
  float single_float;
  REF_INT position;
  size_t local_58;
  size_t local_50;
  ulong local_48;
  ulong local_40;
  REF_DBL *local_38;
  
  ref_mpi = ref_node->ref_mpi;
  uVar6 = 0;
  uVar8 = (ulong)(uint)ref_node->max;
  if (ref_node->max < 1) {
    uVar8 = uVar6;
  }
  uVar17 = 0;
  for (; uVar8 != uVar6; uVar6 = uVar6 + 1) {
    if (l2c[uVar6] != -1) {
      uVar17 = uVar17 + (ref_mpi->id == ref_node->part[uVar6]);
    }
  }
  if ((int)uVar17 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0xff,
           "ref_gather_node_tec_block","malloc sorted_local of REF_INT negative");
LAB_0012fe66:
    RVar3 = 1;
  }
  else {
    sVar9 = (ulong)uVar17 * 4;
    local_38 = scalar;
    sorted_index = (REF_INT *)malloc(sVar9);
    if (sorted_index == (REF_INT *)0x0) {
      pcVar16 = "malloc sorted_local of REF_INT NULL";
      uVar12 = 0xff;
    }
    else {
      original = (REF_GLOB *)malloc((ulong)uVar17 << 3);
      if (original == (REF_GLOB *)0x0) {
        pcVar16 = "malloc sorted_cellnode of REF_GLOB NULL";
        uVar12 = 0x100;
      }
      else {
        pvVar7 = malloc(sVar9);
        if (pvVar7 == (void *)0x0) {
          pcVar16 = "malloc pack of REF_INT NULL";
          uVar12 = 0x101;
        }
        else {
          uVar17 = 0;
          for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
            if ((l2c[uVar6] != -1) && (ref_mpi->id == ref_node->part[uVar6])) {
              original[(int)uVar17] = l2c[uVar6];
              *(int *)((long)pvVar7 + (long)(int)uVar17 * 4) = (int)uVar6;
              uVar17 = uVar17 + 1;
            }
          }
          uVar2 = ref_sort_heap_glob(uVar17,original,sorted_index);
          if (uVar2 != 0) {
            pcVar16 = "sort";
            uVar12 = 0x10c;
LAB_0012fed4:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,uVar12,"ref_gather_node_tec_block",(ulong)uVar2,pcVar16);
            return uVar2;
          }
          uVar8 = 0;
          uVar6 = 0;
          if (0 < (int)uVar17) {
            uVar6 = (ulong)uVar17;
          }
          for (; uVar6 != uVar8; uVar8 = uVar8 + 1) {
            iVar10 = *(int *)((long)pvVar7 + (long)sorted_index[uVar8] * 4);
            sorted_index[uVar8] = iVar10;
            original[uVar8] = l2c[iVar10];
          }
          free(pvVar7);
          uVar4 = (int)(nnode / (long)ref_mpi->n) + 1;
          uVar2 = 100000;
          if (100000 < (int)uVar4) {
            uVar2 = uVar4;
          }
          uVar4 = 0x7fffffff;
          if (0 < ref_mpi->reduce_byte_limit) {
            uVar4 = (uint)ref_mpi->reduce_byte_limit >> 3;
          }
          if ((int)uVar2 < (int)uVar4) {
            uVar4 = uVar2;
          }
          sVar9 = (ulong)uVar4 * 8;
          pvVar7 = malloc(sVar9);
          if (pvVar7 == (void *)0x0) {
            pcVar16 = "malloc local_xyzm of REF_DBL NULL";
            uVar12 = 0x118;
          }
          else {
            __ptr = malloc(sVar9);
            if (__ptr != (void *)0x0) {
              iVar10 = -3;
              if (-3 < ldim) {
                iVar10 = ldim;
              }
              uVar13 = 0;
              local_a8 = 0;
              local_48 = (ulong)uVar4;
              do {
                if (uVar13 == iVar10 + 3U) {
                  free(__ptr);
                  free(pvVar7);
                  free(original);
                  free(sorted_index);
                  return 0;
                }
                sVar9 = 0;
                while (uVar8 = nnode - sVar9, uVar8 != 0 && (long)sVar9 <= nnode) {
                  local_40 = uVar8;
                  if ((long)local_48 <= (long)uVar8) {
                    local_40 = local_48;
                  }
                  local_58 = (size_t)(int)local_40;
                  for (uVar8 = 0; local_48 != uVar8; uVar8 = uVar8 + 1) {
                    *(undefined8 *)((long)pvVar7 + uVar8 * 8) = 0;
                  }
                  sVar15 = local_58 + sVar9;
                  uVar8 = 0;
                  if (0 < (int)local_40) {
                    uVar8 = local_40 & 0xffffffff;
                  }
                  local_50 = sVar9;
                  for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
                    uVar2 = ref_sort_search_glob(uVar17,original,local_50 + uVar6,&position);
                    if ((uVar2 != 0) && (uVar2 != 5)) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                             ,0x129,"ref_gather_node_tec_block",(ulong)uVar2,"node local failed");
                      local_a8 = uVar2;
                    }
                    if (uVar2 != 5) {
                      if (uVar2 != 0) {
                        return local_a8;
                      }
                      if (uVar13 < 3) {
                        iVar5 = sorted_index[position] * 0xf + uVar13;
                        pRVar11 = ref_node->real;
                      }
                      else {
                        iVar5 = sorted_index[position] * ldim + (uVar13 - 3);
                        pRVar11 = local_38;
                      }
                      *(REF_DBL *)((long)pvVar7 + uVar6 * 8) = pRVar11[iVar5];
                    }
                  }
                  uVar2 = ref_mpi_sum(ref_mpi,pvVar7,__ptr,(REF_INT)local_40,3);
                  sVar1 = local_58;
                  if (uVar2 != 0) {
                    pcVar16 = "sum";
                    uVar12 = 0x134;
                    goto LAB_0012fed4;
                  }
                  sVar9 = sVar15;
                  if (ref_mpi->id == 0) {
                    if (dataformat == 2) {
                      sVar15 = fwrite(__ptr,8,local_58,(FILE *)file);
                      if (sVar1 != sVar15) {
                        pcVar16 = "block chunk";
                        uVar12 = 0x142;
                        nnode = local_58;
                        sVar9 = sVar15;
                        goto LAB_001302db;
                      }
                    }
                    else {
                      if (dataformat != 1) {
                        return 6;
                      }
                      for (lVar14 = 0; sVar9 = sVar15, uVar8 << 3 != lVar14; lVar14 = lVar14 + 8) {
                        single_float = (float)*(double *)((long)__ptr + lVar14);
                        sVar9 = fwrite(&single_float,4,1,(FILE *)file);
                        if (sVar9 != 1) {
                          pcVar16 = "single float";
                          uVar12 = 0x13d;
                          nnode = 1;
                          goto LAB_001302db;
                        }
                      }
                    }
                  }
                }
                uVar13 = uVar13 + 1;
              } while (nnode == sVar9);
              pcVar16 = "node miscount";
              uVar12 = 0x149;
LAB_001302db:
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,uVar12,"ref_gather_node_tec_block",pcVar16,nnode,sVar9);
              goto LAB_0012fe66;
            }
            pcVar16 = "malloc xyzm of REF_DBL NULL";
            uVar12 = 0x119;
          }
        }
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar12
           ,"ref_gather_node_tec_block",pcVar16);
    RVar3 = 2;
  }
  return RVar3;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_node_tec_block(
    REF_NODE ref_node, REF_GLOB nnode, REF_GLOB *l2c, REF_INT ldim,
    REF_DBL *scalar, int dataformat, FILE *file) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT chunk;
  REF_DBL *local_xyzm, *xyzm;
  REF_GLOB nnode_written, first, global;
  REF_INT local, n, i, ivar;
  REF_STATUS status;
  REF_INT *sorted_local, *pack, total_cellnode, position;
  REF_GLOB *sorted_cellnode;

  total_cellnode = 0;
  for (i = 0; i < ref_node_max(ref_node); i++) {
    if (REF_EMPTY != l2c[i] && ref_node_owned(ref_node, i)) {
      total_cellnode++;
    }
  }

  ref_malloc(sorted_local, total_cellnode, REF_INT);
  ref_malloc(sorted_cellnode, total_cellnode, REF_GLOB);
  ref_malloc(pack, total_cellnode, REF_INT);

  total_cellnode = 0;
  for (i = 0; i < ref_node_max(ref_node); i++) {
    if (REF_EMPTY != l2c[i] && ref_node_owned(ref_node, i)) {
      sorted_cellnode[total_cellnode] = l2c[i];
      pack[total_cellnode] = i;
      total_cellnode++;
    }
  }
  RSS(ref_sort_heap_glob(total_cellnode, sorted_cellnode, sorted_local),
      "sort");
  for (i = 0; i < total_cellnode; i++) {
    sorted_local[i] = pack[sorted_local[i]];
    sorted_cellnode[i] = l2c[sorted_local[i]];
  }
  ref_free(pack);

  chunk = (REF_INT)(nnode / ref_mpi_n(ref_mpi) + 1);
  chunk = MAX(chunk, 100000);
  chunk =
      MIN(chunk, ref_mpi_reduce_chunk_limit(ref_mpi, (REF_INT)sizeof(REF_DBL)));

  ref_malloc(local_xyzm, chunk, REF_DBL);
  ref_malloc(xyzm, chunk, REF_DBL);

  for (ivar = 0; ivar < 3 + ldim; ivar++) {
    nnode_written = 0;
    while (nnode_written < nnode) {
      first = nnode_written;
      n = (REF_INT)MIN((REF_GLOB)chunk, nnode - nnode_written);

      nnode_written += n;

      for (i = 0; i < chunk; i++) local_xyzm[i] = 0.0;

      for (i = 0; i < n; i++) {
        global = first + i;
        status = ref_sort_search_glob(total_cellnode, sorted_cellnode, global,
                                      &position);
        RXS(status, REF_NOT_FOUND, "node local failed");
        if (REF_SUCCESS == status) {
          local = sorted_local[position];
          if (ivar < 3) {
            local_xyzm[i] = ref_node_xyz(ref_node, ivar, local);
          } else {
            local_xyzm[i] = scalar[(ivar - 3) + ldim * local];
          }
        }
      }

      RSS(ref_mpi_sum(ref_mpi, local_xyzm, xyzm, n, REF_DBL_TYPE), "sum");

      if (ref_mpi_once(ref_mpi)) {
        switch (dataformat) {
          case 1:
            for (i = 0; i < n; i++) {
              float single_float;
              single_float = (float)xyzm[i];
              REIS(1, fwrite(&single_float, sizeof(float), 1, file),
                   "single float");
            }
            break;
          case 2:
            REIS(n, fwrite(xyzm, sizeof(double), (unsigned long)n, file),
                 "block chunk");
            break;
          default:
            return REF_IMPLEMENT;
        }
      }
    }
    REIS(nnode, nnode_written, "node miscount");
  }

  ref_free(xyzm);
  ref_free(local_xyzm);
  ref_free(sorted_cellnode);
  ref_free(sorted_local);

  return REF_SUCCESS;
}